

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

string * getUserInputDirForFile(string *filename)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  string *in_RDI;
  int n;
  int searchPathAmount;
  string *searchPath;
  undefined8 in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  string local_d8 [32];
  string local_b8 [16];
  string *in_stack_ffffffffffffff58;
  string local_98 [35];
  byte local_75;
  uint local_74;
  string local_70 [32];
  string local_50 [55];
  byte local_19;
  int local_18;
  int local_14;
  
  local_14 = Settings::searchPathAmount();
  local_18 = 0;
  while( true ) {
    if (local_14 <= local_18) {
      do {
        std::operator<<((ostream *)&std::cout,
                        "Please specify the directory where this library is located (or enter \'quit\' to abort): "
                       );
        fflush(_stdout);
        local_75 = 0;
        std::__cxx11::string::string((string *)in_RDI);
        std::operator>>((istream *)&std::cin,(string *)in_RDI);
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        iVar2 = std::__cxx11::string::compare((char *)in_RDI);
        if (iVar2 == 0) {
          exit(1);
        }
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::__cxx11::string::size();
          in_stack_fffffffffffffef0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::operator[]((ulong)in_RDI);
          if (in_stack_fffffffffffffef0->_M_dataplus != (_Alloc_hider)0x2f) {
            std::__cxx11::string::operator+=((string *)in_RDI,"/");
          }
        }
        std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        bVar1 = fileExists(in_stack_ffffffffffffff58);
        std::__cxx11::string::~string(local_98);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          poVar5 = std::operator<<((ostream *)&std::cerr,local_d8);
          poVar5 = std::operator<<(poVar5,
                                   " was found. /!\\ DYLIBBUNDLER MAY NOT CORRECTLY HANDLE THIS DEPENDENCY: Manually check the executable with \'otool -L\'"
                                  );
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_d8);
          Settings::addSearchPath((string *)0x140371);
          local_75 = 1;
          local_74 = 1;
        }
        else {
          std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          poVar5 = std::operator<<((ostream *)&std::cerr,local_b8);
          poVar5 = std::operator<<(poVar5," does not exist. Try again");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_b8);
          local_74 = 5;
        }
        if ((local_75 & 1) == 0) {
          std::__cxx11::string::~string((string *)in_RDI);
        }
      } while (local_74 != 1);
      return in_RDI;
    }
    local_19 = 0;
    Settings::searchPath_abi_cxx11_((int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      if (*pcVar4 != '/') {
        std::__cxx11::string::operator+=((string *)in_RDI,"/");
      }
    }
    std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    bVar1 = fileExists(in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_50);
    if (bVar1) {
      std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      poVar5 = std::operator<<((ostream *)&std::cerr,local_70);
      in_stack_fffffffffffffef8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(poVar5,
                           " was found. /!\\ DYLIBBUNDLER MAY NOT CORRECTLY HANDLE THIS DEPENDENCY: Manually check the executable with \'otool -L\'"
                          );
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffef8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_70);
      local_19 = 1;
    }
    local_74 = (uint)bVar1;
    if ((local_19 & 1) == 0) {
      std::__cxx11::string::~string((string *)in_RDI);
    }
    if (local_74 != 0) break;
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

std::string getUserInputDirForFile(const std::string& filename)
{
    const int searchPathAmount = Settings::searchPathAmount();
    for(int n=0; n<searchPathAmount; n++)
    {
        auto searchPath = Settings::searchPath(n);
        if( !searchPath.empty() && searchPath[ searchPath.size()-1 ] != '/' ) searchPath += "/";

        if( fileExists( searchPath+filename ) )
        {
            std::cerr << (searchPath+filename) << " was found. /!\\ DYLIBBUNDLER MAY NOT CORRECTLY HANDLE THIS DEPENDENCY: Manually check the executable with 'otool -L'" << std::endl;
            return searchPath;
        }
    }

    while (true)
    {
        std::cout << "Please specify the directory where this library is located (or enter 'quit' to abort): ";  fflush(stdout);

        std::string prefix;
        std::cin >> prefix;
        std::cout << std::endl;

        if(prefix.compare("quit")==0) exit(1);

        if( !prefix.empty() && prefix[ prefix.size()-1 ] != '/' ) prefix += "/";

        if( !fileExists( prefix+filename ) )
        {
            std::cerr << (prefix+filename) << " does not exist. Try again" << std::endl;
            continue;
        }
        else
        {
            std::cerr << (prefix+filename) << " was found. /!\\ DYLIBBUNDLER MAY NOT CORRECTLY HANDLE THIS DEPENDENCY: Manually check the executable with 'otool -L'" << std::endl;
            Settings::addSearchPath(prefix);
            return prefix;
        }
    }
}